

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O2

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<10,_5,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  Type in0;
  undefined1 local_54 [20];
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  VecAccess<float,_4,_3> local_28;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    getInputValue<2,5>((ShaderEvalContext *)local_54,(int)evalCtx);
  }
  else {
    tcu::Matrix<float,_2,_2>::Matrix((Matrix<float,_2,_2> *)local_54,(float *)s_constInMat2x2);
  }
  negate<float,2,2>((MatrixCaseUtils *)&local_38,(Matrix<float,_2,_2> *)local_54);
  local_3c = local_34 + local_2c;
  local_54._16_4_ = local_38;
  local_40 = local_30;
  local_28.m_vector = &evalCtx->color;
  local_28.m_index[0] = 0;
  local_28.m_index[1] = 1;
  local_28.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_28,(Vector<float,_3> *)(local_54 + 0x10));
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(negate(in0));
	}